

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O2

Status cmFileTimes::Copy(string *fromFile,string *toFile)

{
  Status SVar1;
  cmFileTimes fileTimes;
  _Head_base<0UL,_cmFileTimes::Times_*,_false> local_18;
  
  local_18._M_head_impl = (Times *)0x0;
  SVar1 = Load((cmFileTimes *)&local_18,fromFile);
  if (SVar1.Kind_ == Success) {
    SVar1 = Store((cmFileTimes *)&local_18,toFile);
  }
  std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::~unique_ptr
            ((unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_> *)&local_18);
  return SVar1;
}

Assistant:

cmsys::Status cmFileTimes::Copy(std::string const& fromFile,
                                std::string const& toFile)
{
  cmFileTimes fileTimes;
  cmsys::Status load_status = fileTimes.Load(fromFile);
  if (!load_status) {
    return load_status;
  }
  return fileTimes.Store(toFile);
}